

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage_converter.cpp
# Opt level: O0

bool test_from(base_converter *cvt,uint codepoint,char *str)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  uint res;
  char buf [32];
  bool local_4d;
  undefined1 local_48 [32];
  undefined1 auStack_28 [8];
  char *local_20;
  bool local_1;
  
  local_20 = in_RDX;
  uVar1 = (**(code **)(*in_RDI + 0x30))(in_RDI,in_ESI,local_48,auStack_28);
  if (uVar1 == 0xffffffff) {
    local_1 = local_20 == (char *)0x0;
  }
  else {
    local_4d = false;
    if (local_20 != (char *)0x0) {
      sVar3 = strlen(local_20);
      local_4d = false;
      if (sVar3 == uVar1) {
        iVar2 = memcmp(local_20,local_48,(ulong)uVar1);
        local_4d = iVar2 == 0;
      }
    }
    local_1 = local_4d;
  }
  return local_1;
}

Assistant:

bool test_from(booster::locale::util::base_converter &cvt,unsigned codepoint,char const *str)
{
    char buf[32];
    unsigned res = cvt.from_unicode(codepoint,buf,buf+sizeof(buf));
    if(res == booster::locale::util::base_converter::illegal) {
        return str == 0;
    }
    else {
        return str!=0 && strlen(str) == res && memcmp(str,buf,res) == 0;
    }
}